

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>_>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>_>
                   *this)

{
  undefined1 *__ptr;
  undefined1 *puVar1;
  
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_false>
          ).
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_void>
          .super_SmallVectorBase.BeginX;
  puVar1 = (undefined1 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_void>
           .super_SmallVectorBase.EndX;
  if (puVar1 != __ptr) {
    do {
      if (puVar1 + -0xf0 != *(undefined1 **)(puVar1 + -0x108)) {
        free(*(undefined1 **)(puVar1 + -0x108));
      }
      puVar1 = puVar1 + -0x158;
    } while (puVar1 != __ptr);
    __ptr = (undefined1 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_void>
            .super_SmallVectorBase.BeginX;
  }
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<382U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<375U,_Fixpp::Type::String>,_Fixpp::TagT<337U,_Fixpp::Type::String>,_Fixpp::TagT<437U,_Fixpp::Type::Float>,_Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>,_void>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }